

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handle,vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                  *params,string *argumentType,string *argumentName)

{
  pointer pcVar1;
  _Base_ptr p_Var2;
  size_t __n;
  _Base_ptr p_Var3;
  _Base_ptr __n_00;
  pointer pPVar4;
  VulkanHppGenerator *pVVar5;
  size_type __n_01;
  bool bVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  TypeInfo *pTVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  _Base_ptr p_Var16;
  undefined8 uVar17;
  VulkanHppGenerator *this_00;
  _Alloc_hider _Var18;
  pointer pPVar19;
  string *psVar20;
  pointer this_01;
  string argument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  string *local_d8;
  VulkanHppGenerator *local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  *local_c8;
  TypeInfo *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  VulkanHppGenerator *local_50;
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *local_48;
  TypeInfo *local_40;
  _Base_ptr local_38;
  
  local_d0 = this;
  std::operator+(&local_158,"*reinterpret_cast<",argumentType);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_158," *>( &");
  paVar14 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p == paVar11) {
    local_138.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_138._M_dataplus._M_p = (pointer)paVar14;
  }
  else {
    local_138.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_138._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_138,(argumentName->_M_dataplus)._M_p,argumentName->_M_string_length);
  pVVar5 = local_d0;
  local_90.first._M_dataplus._M_p = (pointer)&local_90.first.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar12 = &pbVar8->field_2;
  if (paVar11 == paVar12) {
    local_90.first.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_90.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_90.first.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_90.first._M_dataplus._M_p = (pointer)paVar11;
  }
  local_90.first._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_90.first," )");
  paVar11 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar11;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar12 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar12) {
    uVar17 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    paVar11->_M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar17;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    operator_delete(local_90.first._M_dataplus._M_p,local_90.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar14) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)(handle->second).destructorIt._M_node !=
      &(pVVar5->m_commands)._M_t._M_impl.super__Rb_tree_header) {
    local_d8 = __return_storage_ptr__;
    local_98 = paVar11;
    getParentTypeAndName(&local_90,pVVar5,handle);
    std::operator+(&local_138,"Vk",&local_90.first);
    local_48 = params;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_90.first,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar14) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    p_Var2 = (handle->second).destructorIt._M_node;
    pTVar13 = (TypeInfo *)p_Var2[5]._M_parent;
    local_40 = (TypeInfo *)p_Var2[5]._M_left;
    local_c8 = handle;
    if (pTVar13 != local_40) {
      local_50 = (VulkanHppGenerator *)&local_d0->m_structs;
      local_38 = &(local_d0->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header;
      do {
        psVar20 = &pTVar13->type;
        __n = (pTVar13->type)._M_string_length;
        local_c0 = pTVar13;
        if (((__n != local_90.first._M_string_length) ||
            ((__n != 0 &&
             (iVar7 = bcmp((psVar20->_M_dataplus)._M_p,local_90.first._M_dataplus._M_p,__n),
             iVar7 != 0)))) &&
           ((__n != (local_c8->first)._M_string_length ||
            ((__n != 0 &&
             (iVar7 = bcmp((psVar20->_M_dataplus)._M_p,(local_c8->first)._M_dataplus._M_p,__n),
             iVar7 != 0)))))) {
          p_Var2 = (local_c8->second).destructorIt._M_node;
          p_Var16 = p_Var2[5]._M_parent;
          p_Var3 = p_Var2[5]._M_left;
          if (p_Var16 != p_Var3) {
            pcVar1 = local_c0[1].prefix._M_dataplus._M_p;
            __n_00 = (_Base_ptr)local_c0[1].prefix._M_string_length;
            do {
              if ((*(_Base_ptr *)(p_Var16 + 5) == __n_00) &&
                 ((__n_00 == (_Base_ptr)0x0 ||
                  (iVar7 = bcmp(p_Var16[4]._M_right,pcVar1,(size_t)__n_00), iVar7 == 0))))
              goto LAB_00188736;
              p_Var16 = (_Base_ptr)&p_Var16[8]._M_parent;
            } while (p_Var16 != p_Var3);
          }
          this_01 = (local_48->
                    super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pPVar4 = (local_48->
                   super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (this_01 == pPVar4) {
LAB_00188944:
            __assert_fail("found",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x28e5,
                          "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                         );
          }
          pcVar1 = (psVar20->_M_dataplus)._M_p;
          pPVar19 = this_01;
          do {
            if (((pPVar19->type).type._M_string_length == __n) &&
               ((__n == 0 ||
                (iVar7 = bcmp((pPVar19->type).type._M_dataplus._M_p,pcVar1,__n), iVar7 == 0)))) {
              bVar6 = isHandleType(local_d0,psVar20);
              pTVar13 = local_c0;
              if (!bVar6) {
                iVar7 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (psVar20,"VkAllocationCallbacks");
                if (iVar7 != 0) {
                  __assert_fail("destructorParam.type.type == \"VkAllocationCallbacks\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                ,0x28c6,
                                "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                               );
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(local_d8,", allocator");
                goto LAB_00188736;
              }
              bVar6 = TypeInfo::isValue(local_c0);
              if (!bVar6) {
                __assert_fail("destructorParam.type.isValue()",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                              ,0x28c1,
                              "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                             );
              }
              std::operator+(&local_118,", static_cast<",psVar20);
              psVar20 = local_d8;
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_118,">( *");
              local_f8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
              paVar14 = &pbVar8->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p == paVar14) {
                local_f8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              }
              else {
                local_f8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
              }
              local_f8._M_string_length = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
              pbVar8->_M_string_length = 0;
              (pbVar8->field_2)._M_local_buf[0] = '\0';
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_f8,pTVar13[1].prefix._M_dataplus._M_p,
                                  pTVar13[1].prefix._M_string_length);
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar8->_M_dataplus)._M_p;
              paVar11 = &pbVar8->field_2;
              if (paVar14 == paVar11) {
                local_158.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
                local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              }
              else {
                local_158.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
                local_158._M_dataplus._M_p = (pointer)paVar14;
              }
              local_158._M_string_length = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
              pbVar8->_M_string_length = 0;
              (pbVar8->field_2)._M_local_buf[0] = '\0';
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_158," )");
              local_138._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
              paVar14 = &pbVar8->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p == paVar14) {
                local_138.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              }
              else {
                local_138.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
              }
              local_138._M_string_length = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
              pbVar8->_M_string_length = 0;
              (pbVar8->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(psVar20,local_138._M_dataplus._M_p,local_138._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              uVar17 = local_118.field_2._M_allocated_capacity;
              _Var18._M_p = local_118._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_0018872e;
              goto LAB_00188736;
            }
            pVVar5 = local_50;
            pPVar19 = pPVar19 + 1;
          } while (pPVar19 != pPVar4);
          while( true ) {
            if (this_01 == pPVar4) goto LAB_00188944;
            this_00 = pVVar5;
            cVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                            *)pVVar5,&(this_01->type).type);
            if ((cVar9._M_node != local_38) &&
               (cVar10 = findStructMemberItByType
                                   (this_00,psVar20,
                                    (vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                                     *)&cVar9._M_node[3]._M_right),
               cVar10._M_current != *(MemberData **)(cVar9._M_node + 4))) break;
            this_01 = this_01 + 1;
          }
          bVar6 = TypeInfo::isValue(&this_01->type);
          if (bVar6) {
            __assert_fail("!param.type.isValue()",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x28da,
                          "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                         );
          }
          paVar11 = &local_b8.field_2;
          local_b8._M_dataplus._M_p = (pointer)paVar11;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"p","");
          paVar14 = &local_118.field_2;
          pcVar1 = (this_01->name)._M_dataplus._M_p;
          local_118._M_dataplus._M_p = (pointer)paVar14;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,pcVar1,pcVar1 + (this_01->name)._M_string_length);
          __n_01 = local_b8._M_string_length;
          if ((local_b8._M_string_length <= local_118._M_string_length) &&
             ((local_b8._M_string_length == 0 ||
              (iVar7 = bcmp(local_118._M_dataplus._M_p,local_b8._M_dataplus._M_p,
                            local_b8._M_string_length), iVar7 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_118,0,__n_01);
          }
          anon_unknown.dwarf_18c225::startLowerCase(&local_f8,&local_118);
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_f8,".");
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar8->_M_dataplus)._M_p;
          paVar15 = &pbVar8->field_2;
          if (paVar12 == paVar15) {
            local_158.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
            local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          }
          else {
            local_158.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
            local_158._M_dataplus._M_p = (pointer)paVar12;
          }
          local_158._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar15;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_158,((cVar10._M_current)->name)._M_dataplus._M_p,
                             ((cVar10._M_current)->name)._M_string_length);
          local_138._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar12 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p == paVar12) {
            local_138.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          }
          else {
            local_138.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          }
          local_138._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != paVar14) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar11) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          psVar20 = &((cVar10._M_current)->type).type;
          bVar6 = isHandleType(local_d0,psVar20);
          if (bVar6) {
            std::operator+(&local_b8,"static_cast<",psVar20);
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_b8,">( ");
            local_118._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar12 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p == paVar12) {
              local_118.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_118._M_dataplus._M_p = (pointer)paVar14;
            }
            else {
              local_118.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            }
            local_118._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append(&local_118,local_138._M_dataplus._M_p,local_138._M_string_length);
            local_f8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar12 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p == paVar12) {
              local_f8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            }
            else {
              local_f8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            }
            local_f8._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_f8," )");
            local_158._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar12 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p == paVar12) {
              local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            }
            else {
              local_158.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            }
            local_158._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_138,&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar14) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar11) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
          }
          std::operator+(&local_158,", ",&local_138);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (local_d8,local_158._M_dataplus._M_p,local_158._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          uVar17 = local_138.field_2._M_allocated_capacity;
          _Var18._M_p = local_138._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
LAB_0018872e:
            operator_delete(_Var18._M_p,uVar17 + 1);
          }
        }
LAB_00188736:
        pTVar13 = (TypeInfo *)&local_c0[2].postfix._M_string_length;
      } while (pTVar13 != local_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.second._M_dataplus._M_p != &local_90.second.field_2) {
      operator_delete(local_90.second._M_dataplus._M_p,
                      local_90.second.field_2._M_allocated_capacity + 1);
    }
    __return_storage_ptr__ = local_d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
      operator_delete(local_90.first._M_dataplus._M_p,
                      local_90.first.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments( std::pair<std::string, HandleData> const & handle,
                                                                                std::vector<ParamData> const &             params,
                                                                                std::string const &                        argumentType,
                                                                                std::string const &                        argumentName ) const
{
  std::string arguments = "*reinterpret_cast<" + argumentType + " *>( &" + argumentName + " )";
  if ( handle.second.destructorIt != m_commands.end() )
  {
    auto [parentType, parentName] = getParentTypeAndName( handle );
    parentType                    = "Vk" + parentType;
    for ( auto const & destructorParam : handle.second.destructorIt->second.params )
    {
      if ( ( destructorParam.type.type != parentType ) && ( destructorParam.type.type != handle.first ) &&
           std::ranges::none_of( handle.second.destructorIt->second.params,
                                 [&destructorParam]( ParamData const & pd ) { return pd.lenExpression == destructorParam.name; } ) )
      {
        if ( std::ranges::any_of( params, [&destructorParam]( ParamData const & pd ) { return pd.type.type == destructorParam.type.type; } ) )
        {
          if ( isHandleType( destructorParam.type.type ) )
          {
            assert( destructorParam.type.isValue() );
            arguments += ", static_cast<" + destructorParam.type.type + ">( *" + destructorParam.name + " )";
          }
          else
          {
            assert( destructorParam.type.type == "VkAllocationCallbacks" );
            arguments += ", allocator";
          }
        }
        else
        {
#if !defined( NDEBUG )
          bool found = false;
#endif
          for ( auto const & param : params )
          {
            auto structureIt = m_structs.find( param.type.type );
            if ( structureIt != m_structs.end() )
            {
              auto memberIt = findStructMemberItByType( destructorParam.type.type, structureIt->second.members );
              if ( memberIt != structureIt->second.members.end() )
              {
#if !defined( NDEBUG )
                found = true;
#endif
                assert( !param.type.isValue() );
                std::string argument = startLowerCase( stripPrefix( param.name, "p" ) ) + "." + memberIt->name;
                if ( isHandleType( memberIt->type.type ) )
                {
                  argument = "static_cast<" + memberIt->type.type + ">( " + argument + " )";
                }
                arguments += ", " + argument;
                break;
              }
            }
          }
          assert( found );
        }
      }
    }
  }
  return arguments;
}